

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_function.c
# Opt level: O2

nativeFunc get_native_function(char *function_name)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = strcmp(function_name,"print_char");
  if (iVar1 == 0) {
    pcVar2 = print_char;
  }
  else {
    iVar1 = strcmp(function_name,"assert_true");
    if (iVar1 == 0) {
      pcVar2 = assert_true;
    }
    else {
      iVar1 = strcmp(function_name,"assert_false");
      if (iVar1 == 0) {
        pcVar2 = assert_false;
      }
      else {
        iVar1 = strcmp(function_name,"assert_eq_i32");
        if (iVar1 == 0) {
          pcVar2 = assert_eq_i32;
        }
        else {
          iVar1 = strcmp(function_name,"assert_eq_i64");
          if (iVar1 == 0) {
            pcVar2 = assert_eq_i64;
          }
          else {
            iVar1 = strcmp(function_name,"assert_eq_f32");
            if (iVar1 == 0) {
              pcVar2 = assert_eq_f32;
            }
            else {
              iVar1 = strcmp(function_name,"assert_eq_f64");
              if (iVar1 != 0) {
                fwrite("unknown native function",0x17,1,_stderr);
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/wasm/vm/native_function.c"
                              ,0x3a,"nativeFunc get_native_function(const char *)");
              }
              pcVar2 = assert_eq_f64;
            }
          }
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

nativeFunc get_native_function(const char *function_name) {
    if (!strcmp(function_name, "print_char")) {
        return print_char;
    } else if (!strcmp(function_name, "assert_true")) {
        return assert_true;
    } else if (!strcmp(function_name, "assert_false")) {
        return assert_false;
    } else if (!strcmp(function_name, "assert_eq_i32")) {
        return assert_eq_i32;
    } else if (!strcmp(function_name, "assert_eq_i64")) {
        return assert_eq_i64;
    } else if (!strcmp(function_name, "assert_eq_f32")) {
        return assert_eq_f32;
    } else if (!strcmp(function_name, "assert_eq_f64")) {
        return assert_eq_f64;
    } else {
        errorExit("unknown native function");
    }
    return NULL;
}